

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_extension.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_62a6c::PyIterCtrlPMatchSource<cpsm::FullLineMatch>::fill
          (PyIterCtrlPMatchSource<cpsm::FullLineMatch> *this,
          vector<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
          *items)

{
  pointer *ppPVar1;
  size_t sVar2;
  pointer pPVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pPVar7;
  pointer pPVar8;
  pointer pPVar9;
  _Tp_alloc_type *__alloc;
  long lVar10;
  bool bVar11;
  CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch> local_68;
  _Tp_alloc_type *local_58;
  pointer local_50;
  char *local_48;
  size_t local_40;
  Py_ssize_t item_size;
  
  std::mutex::lock(&this->mu_);
  if (this->done_ == false) {
    lVar10 = 0x200;
    local_68.inner.item_.len_ = (size_t)items;
    while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
      local_68.inner.item_.ptr_ = (char *)PyIter_Next(this->iter_);
      if (local_68.inner.item_.ptr_ == (char *)0x0) {
LAB_0012040b:
        std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                  ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)&local_68);
        this->done_ = true;
        goto LAB_0012041e;
      }
      pcVar4 = (char *)PyUnicode_AsUTF8AndSize(local_68.inner.item_.ptr_,&item_size);
      sVar2 = local_68.inner.item_.len_;
      if (pcVar4 == (char *)0x0) goto LAB_0012040b;
      local_40 = item_size;
      pPVar9 = (((_Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
                  *)local_68.inner.item_.len_)->_M_impl).super__Vector_impl_data._M_finish;
      local_48 = pcVar4;
      if (pPVar9 == (((_Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
                       *)local_68.inner.item_.len_)->_M_impl).super__Vector_impl_data.
                    _M_end_of_storage) {
        pPVar7 = (((_Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
                    *)local_68.inner.item_.len_)->_M_impl).super__Vector_impl_data._M_start;
        if ((long)pPVar9 - (long)pPVar7 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar5 = ((long)pPVar9 - (long)pPVar7) / 0x18;
        uVar6 = uVar5;
        if (pPVar9 == pPVar7) {
          uVar6 = 1;
        }
        __alloc = (_Tp_alloc_type *)(uVar6 + uVar5);
        if ((_Tp_alloc_type *)0x555555555555554 < __alloc) {
          __alloc = (_Tp_alloc_type *)0x555555555555555;
        }
        local_58 = (_Tp_alloc_type *)0x555555555555555;
        if (!CARRY8(uVar6,uVar5)) {
          local_58 = __alloc;
        }
        local_50 = pPVar7;
        if (local_58 == (_Tp_alloc_type *)0x0) {
          pPVar7 = (pointer)0x0;
        }
        else {
          pPVar7 = (pointer)operator_new((long)local_58 * 0x18);
        }
        std::
        allocator_traits<std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,cpsm::FullLineMatch>,true>>>
        ::
        construct<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,cpsm::FullLineMatch>,true>,cpsm::CtrlPItem<cpsm::StringRefItem,cpsm::FullLineMatch>,std::unique_ptr<_object,(anonymous_namespace)::PyObjectDeleter>>
                  ((allocator_type *)(pPVar7 + uVar5),
                   (PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true> *)
                   &stack0xffffffffffffffb8,&local_68,
                   (unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)__alloc);
        pPVar3 = local_50;
        pPVar8 = std::
                 vector<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
                 ::_S_relocate(local_50,pPVar9,pPVar7,__alloc);
        pPVar9 = std::
                 vector<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
                 ::_S_relocate(pPVar9,pPVar9,pPVar8 + 1,__alloc);
        if (pPVar3 != (pointer)0x0) {
          operator_delete(pPVar3);
        }
        (((_Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
           *)local_68.inner.item_.len_)->_M_impl).super__Vector_impl_data._M_start = pPVar7;
        (((_Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
           *)local_68.inner.item_.len_)->_M_impl).super__Vector_impl_data._M_finish = pPVar9;
        (((_Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
           *)local_68.inner.item_.len_)->_M_impl).super__Vector_impl_data._M_end_of_storage =
             pPVar7 + (long)local_58;
      }
      else {
        std::
        allocator_traits<std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,cpsm::FullLineMatch>,true>>>
        ::
        construct<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,cpsm::FullLineMatch>,true>,cpsm::CtrlPItem<cpsm::StringRefItem,cpsm::FullLineMatch>,std::unique_ptr<_object,(anonymous_namespace)::PyObjectDeleter>>
                  ((allocator_type *)pPVar9,
                   (PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true> *)
                   &stack0xffffffffffffffb8,&local_68,
                   (unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)item_size);
        ppPVar1 = &(((_Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
                      *)sVar2)->_M_impl).super__Vector_impl_data._M_finish;
        *ppPVar1 = *ppPVar1 + 1;
      }
      std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)&local_68);
    }
    bVar11 = true;
  }
  else {
LAB_0012041e:
    bVar11 = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar11;
}

Assistant:

bool fill(std::vector<Item>& items) {
    std::lock_guard<std::mutex> lock(mu_);
    if (done_) {
      return false;
    }
    auto const add_item = [&](PyObjPtr item_obj) {
      if (item_obj == nullptr) {
        return false;
      }
      char* item_data;
      Py_ssize_t item_size;
      if (!PyVimString_AsStringAndSize(item_obj.get(), &item_data,
                                       &item_size)) {
        return false;
      }
      items.emplace_back(
          cpsm::CtrlPItem<cpsm::StringRefItem, MatchMode>(
              (cpsm::StringRefItem(boost::string_ref(item_data, item_size)))),
          std::move(item_obj));
      return true;
    };
    for (Py_ssize_t i = 0; i < batch_size(); i++) {
      if (!add_item(PyObjPtr(PyIter_Next(iter_)))) {
        done_ = true;
        return false;
      }
    }
    return true;
  }